

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

bool __thiscall
sisl::body_centered_cubic<char>::dump_to_stream(body_centered_cubic<char> *this,ofstream *stream)

{
  int iVar1;
  uint sig;
  
  iVar1 = *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
  if (iVar1 == 0) {
    std::ostream::write((char *)stream,(long)&sig);
    std::ostream::write((char *)stream,(long)&this->_nx);
    std::ostream::write((char *)stream,(long)&this->_ny);
    std::ostream::write((char *)stream,(long)&this->_nz);
    array_n<char,_3,_std::allocator<char>_>::dump_to_stream(&this->_array,stream);
  }
  return iVar1 == 0;
}

Assistant:

virtual bool dump_to_stream(std::ofstream &stream) const {
            unsigned int sig = 'BBCC';

            if(!stream.good()) return false;

            stream.write((char *)&sig, sizeof(unsigned int));
            stream.write((char *)&_nx, sizeof(unsigned int));
            stream.write((char *)&_ny, sizeof(unsigned int));
            stream.write((char *)&_nz, sizeof(unsigned int));

            _array.dump_to_stream(stream);
            return true;
        }